

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O3

void __thiscall
mocker::LoopInvariantCodeMotion::hoist
          (LoopInvariantCodeMotion *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *loopNodes,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *invariant,size_t preHeader)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hash_node_base *p_Var1;
  BasicBlock *pBVar2;
  const_iterator cVar3;
  ostream *poVar4;
  _List_node_base *p_Var5;
  shared_ptr<mocker::ir::IRInst> *inst;
  _List_node_base *p_Var6;
  shared_ptr<mocker::ir::IRInst> local_70;
  string local_60;
  _Hash_node_base *local_40;
  BasicBlock *local_38;
  
  local_38 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,preHeader);
  p_Var1 = (loopNodes->_M_h)._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_40 = p_Var1;
      pBVar2 = ir::FunctionModule::getMutableBasicBlock
                         ((this->super_FuncPass).func,(size_t)p_Var1[1]._M_nxt);
      for (p_Var6 = (pBVar2->insts).
                    super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var6 != (_List_node_base *)&pBVar2->insts; p_Var6 = p_Var6->_M_next) {
        local_60._M_dataplus._M_p = (pointer)p_Var6[1]._M_next;
        cVar3 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&invariant->_M_h,(key_type *)&local_60);
        if (cVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"hoist: ",7);
          ir::fmtInst_abi_cxx11_(&local_60,(ir *)(p_Var6 + 1),inst);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_60._M_dataplus._M_p,
                              local_60._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var6[1]._M_next;
          local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[1]._M_prev;
          if (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          ir::BasicBlock::appendInstBeforeTerminator(local_38,&local_70);
          if (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var5 = (_List_node_base *)operator_new(0x20);
          p_Var5->_M_prev = (_List_node_base *)0x100000001;
          p_Var5->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001e8d90;
          *(undefined4 *)&p_Var5[1]._M_prev = 0;
          p_Var5[1]._M_next = (_List_node_base *)&PTR__IRInst_001e8de0;
          p_Var6[1]._M_next = p_Var5 + 1;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[1]._M_prev;
          p_Var6[1]._M_prev = p_Var5;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      p_Var1 = local_40->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  removeDeletedInsts((this->super_FuncPass).func);
  return;
}

Assistant:

void LoopInvariantCodeMotion::hoist(
    const std::unordered_set<std::size_t> &loopNodes,
    const std::unordered_set<ir::InstID> &invariant, std::size_t preHeader) {
  auto &preHeaderBB = func.getMutableBasicBlock(preHeader);
  for (auto node : loopNodes) {
    auto &bb = func.getMutableBasicBlock(node);
    for (auto &inst : bb.getMutableInsts()) {
      if (!isIn(invariant, inst->getID()))
        continue;
      std::cerr << "hoist: " << ir::fmtInst(inst) << std::endl;
      preHeaderBB.appendInstBeforeTerminator(inst);
      inst = std::make_shared<ir::Deleted>();
    }
  }
  removeDeletedInsts(func);
}